

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queue.c
# Opt level: O0

void Queue_Push_Front(Queue *q,void *data)

{
  Queue_Node *pQVar1;
  Queue_Node *temp;
  void *data_local;
  Queue *q_local;
  
  if (q != (Queue *)0x0) {
    if (q->first == (Queue_Node *)0x0) {
      pQVar1 = (Queue_Node *)malloc(0x10);
      q->last = pQVar1;
      q->first = pQVar1;
      q->first->data = data;
      q->last->prev = (Queue_Node *)0x0;
      q->size = q->size + 1;
    }
    else {
      pQVar1 = (Queue_Node *)malloc(0x10);
      pQVar1->prev = q->first;
      pQVar1->data = data;
      q->first = pQVar1;
      q->size = q->size + 1;
    }
  }
  return;
}

Assistant:

void Queue_Push_Front(struct Queue *q,void *data)
{
	if(q==NULL)return;
	if(q->first==NULL)
	{
		q->first=q->last=malloc(sizeof(struct Queue_Node));	

		q->first->data=data;
		q->last->prev=NULL;

		++q->size;
	}else
	{
		struct Queue_Node *temp=malloc(sizeof(struct Queue_Node));
		temp->prev=q->first;
		temp->data=data;

		q->first=temp;
		++q->size;
	}

}